

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O0

void __thiscall
TypeFunction::TypeFunction
          (TypeFunction *this,InplaceStr name,TypeBase *returnType,
          IntrusiveList<TypeHandle> arguments)

{
  TypeHandle *local_50;
  TypeHandle *el;
  TypeBase *returnType_local;
  TypeFunction *this_local;
  IntrusiveList<TypeHandle> arguments_local;
  InplaceStr name_local;
  
  local_50 = arguments.head;
  TypeBase::TypeBase(&this->super_TypeBase,0x15,name);
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeFunction_0052ba28;
  this->returnType = returnType;
  (this->arguments).head = local_50;
  (this->arguments).tail = arguments.tail;
  (this->super_TypeBase).size = 0xc;
  (this->super_TypeBase).isGeneric = (bool)(returnType->isGeneric & 1);
  for (; local_50 != (TypeHandle *)0x0; local_50 = local_50->next) {
    (this->super_TypeBase).isGeneric =
         ((this->super_TypeBase).isGeneric & 1U) != 0 || (local_50->type->isGeneric & 1U) != 0;
  }
  (this->super_TypeBase).hasPointers = true;
  return;
}

Assistant:

TypeFunction(InplaceStr name, TypeBase *returnType, IntrusiveList<TypeHandle> arguments): TypeBase(myTypeID, name), returnType(returnType), arguments(arguments)
	{
		size = 4 + NULLC_PTR_SIZE;

		isGeneric = returnType->isGeneric;

		for(TypeHandle *el = arguments.head; el; el = el->next)
			isGeneric |= el->type->isGeneric;

		hasPointers = true;
	}